

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::objectivec::ClassName
                   (string *__return_storage_ptr__,Descriptor *descriptor,string *out_suffix_added)

{
  Descriptor *descriptor_00;
  string name;
  string prefix;
  allocator<char> local_99;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  string local_38;
  
  FileClassPrefix_abi_cxx11_
            (&local_38,*(objectivec **)(descriptor + 0x10),(FileDescriptor *)out_suffix_added);
  ClassNameWorker_abi_cxx11_(&local_58,(objectivec *)descriptor,descriptor_00);
  std::operator+(&local_78,&local_38,&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"_Class",&local_99);
  anon_unknown_0::SanitizeNameForObjC(__return_storage_ptr__,&local_78,&local_98,out_suffix_added);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string ClassName(const Descriptor* descriptor, string* out_suffix_added) {
  // 1. Message names are used as is (style calls for CamelCase, trust it).
  // 2. Check for reserved word at the very end and then suffix things.
  string prefix = FileClassPrefix(descriptor->file());
  string name = ClassNameWorker(descriptor);
  return SanitizeNameForObjC(prefix + name, "_Class", out_suffix_added);
}